

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlGetNamespace(xmlParserCtxtPtr ctxt,xmlChar *prefix)

{
  long lVar1;
  xmlChar **ppxVar2;
  uint uVar3;
  ulong uVar4;
  
  if (ctxt->str_xml == prefix) {
    ppxVar2 = &ctxt->str_xml_ns;
  }
  else {
    uVar4 = (ulong)(uint)ctxt->nsNr;
    do {
      uVar3 = (uint)uVar4;
      if ((int)uVar3 < 2) {
        return (xmlChar *)0x0;
      }
      ppxVar2 = ctxt->nsTab;
      lVar1 = uVar4 - 2;
      uVar4 = uVar4 - 2;
    } while (ppxVar2[lVar1] != prefix);
    if ((prefix == (xmlChar *)0x0) && (*ppxVar2[(ulong)(uVar3 & 0x7fffffff) - 1] == '\0')) {
      return (xmlChar *)0x0;
    }
    ppxVar2 = ppxVar2 + ((ulong)(uVar3 & 0x7fffffff) - 1);
  }
  return *ppxVar2;
}

Assistant:

static const xmlChar *
xmlGetNamespace(xmlParserCtxtPtr ctxt, const xmlChar *prefix) {
    int i;

    if (prefix == ctxt->str_xml) return(ctxt->str_xml_ns);
    for (i = ctxt->nsNr - 2;i >= 0;i-=2)
        if (ctxt->nsTab[i] == prefix) {
	    if ((prefix == NULL) && (*ctxt->nsTab[i + 1] == 0))
	        return(NULL);
	    return(ctxt->nsTab[i + 1]);
	}
    return(NULL);
}